

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt32
          (OptionInterpreter *this,int number,int32 value,Type type,UnknownFieldSet *unknown_fields)

{
  LogMessage *pLVar1;
  uint64 value_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (type == TYPE_SINT32) {
    value_00 = (uint64)(uint)(value >> 0x1f ^ value * 2);
  }
  else {
    if (type == TYPE_SFIXED32) {
      UnknownFieldSet::AddFixed32(unknown_fields,number,value);
      return;
    }
    if (type != TYPE_INT32) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                 ,0x1317);
      pLVar1 = internal::LogMessage::operator<<(&local_48,"Invalid wire type for CPPTYPE_INT32: ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,type);
      internal::LogFinisher::operator=(&local_49,pLVar1);
      internal::LogMessage::~LogMessage(&local_48);
      return;
    }
    value_00 = (uint64)value;
  }
  UnknownFieldSet::AddVarint(unknown_fields,number,value_00);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt32(int number, int32 value,
    FieldDescriptor::Type type, UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      unknown_fields->AddVarint(number,
        static_cast<uint64>(static_cast<int64>(value)));
      break;

    case FieldDescriptor::TYPE_SFIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32>(value));
      break;

    case FieldDescriptor::TYPE_SINT32:
      unknown_fields->AddVarint(number,
          google::protobuf::internal::WireFormatLite::ZigZagEncode32(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT32: " << type;
      break;
  }
}